

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int codebook_decode_deinterleave_repeat
              (vorb *f,Codebook *c,float **outputs,int ch,int *c_inter_p,int *p_inter_p,int len,
              int total_decode)

{
  byte bVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  
  if (c->lookup_type == '\0') {
    f->error = VORBIS_invalid_stream;
    return 0;
  }
  uVar9 = (ulong)(uint)c->dimensions;
  iVar10 = *p_inter_p;
  iVar8 = *c_inter_p;
  while( true ) {
    if (total_decode < 1) {
      *c_inter_p = iVar8;
      *p_inter_p = iVar10;
      return 1;
    }
    if (f->valid_bits < 10) {
      prep_huffman(f);
    }
    iVar3 = (int)c->fast_huffman[f->acc & 0x3ff];
    if (iVar3 < 0) {
      iVar3 = codebook_decode_scalar_raw(f,c);
      iVar6 = iVar3;
    }
    else {
      bVar1 = c->codeword_lengths[iVar3];
      f->acc = f->acc >> (bVar1 & 0x1f);
      iVar6 = f->valid_bits - (uint)bVar1;
      iVar7 = iVar6;
      if (iVar6 < 1) {
        iVar7 = 0;
      }
      f->valid_bits = iVar7;
    }
    if (iVar6 < 0) break;
    if (len * ch < (int)uVar9 + iVar8 + iVar10 * ch) {
      uVar9 = (ulong)(uint)((len * ch - iVar10 * ch) + iVar8);
    }
    uVar5 = 0;
    if (0 < (int)uVar9) {
      uVar5 = uVar9;
    }
    lVar4 = (long)(iVar3 * c->dimensions);
    if (c->sequence_p == '\0') {
      while (bVar11 = uVar5 != 0, uVar5 = uVar5 - 1, bVar11) {
        pfVar2 = outputs[iVar8];
        if (pfVar2 != (float *)0x0) {
          pfVar2[iVar10] = c->multiplicands[lVar4] + 0.0 + pfVar2[iVar10];
        }
        iVar3 = iVar8 + 1;
        iVar8 = iVar3;
        if (iVar3 == ch) {
          iVar8 = 0;
        }
        iVar10 = iVar10 + (uint)(iVar3 == ch);
        lVar4 = lVar4 + 1;
      }
    }
    else {
      fVar12 = 0.0;
      while (bVar11 = uVar5 != 0, uVar5 = uVar5 - 1, bVar11) {
        fVar12 = fVar12 + c->multiplicands[lVar4];
        pfVar2 = outputs[iVar8];
        if (pfVar2 != (float *)0x0) {
          pfVar2[iVar10] = pfVar2[iVar10] + fVar12;
        }
        iVar3 = iVar8 + 1;
        iVar8 = iVar3;
        if (iVar3 == ch) {
          iVar8 = 0;
        }
        iVar10 = iVar10 + (uint)(iVar3 == ch);
        lVar4 = lVar4 + 1;
      }
    }
    total_decode = total_decode - (int)uVar9;
  }
  if ((f->bytes_in_seg == '\0') && (f->last_seg != 0)) {
    return 0;
  }
  f->error = VORBIS_invalid_stream;
  return 0;
}

Assistant:

static int codebook_decode_deinterleave_repeat(vorb *f, Codebook *c, float **outputs, int ch, int *c_inter_p, int *p_inter_p, int len, int total_decode)
{
   int c_inter = *c_inter_p;
   int p_inter = *p_inter_p;
   int i,z, effective = c->dimensions;

   // type 0 is only legal in a scalar context
   if (c->lookup_type == 0)   return error(f, VORBIS_invalid_stream);

   while (total_decode > 0) {
      float last = CODEBOOK_ELEMENT_BASE(c);
      DECODE_VQ(z,f,c);
      #ifndef STB_VORBIS_DIVIDES_IN_CODEBOOK
      assert(!c->sparse || z < c->sorted_entries);
      #endif
      if (z < 0) {
         if (!f->bytes_in_seg)
            if (f->last_seg) return FALSE;
         return error(f, VORBIS_invalid_stream);
      }

      // if this will take us off the end of the buffers, stop short!
      // we check by computing the length of the virtual interleaved
      // buffer (len*ch), our current offset within it (p_inter*ch)+(c_inter),
      // and the length we'll be using (effective)
      if (c_inter + p_inter*ch + effective > len * ch) {
         effective = len*ch - (p_inter*ch - c_inter);
      }

   #ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
      if (c->lookup_type == 1) {
         int div = 1;
         for (i=0; i < effective; ++i) {
            int off = (z / div) % c->lookup_values;
            float val = CODEBOOK_ELEMENT_FAST(c,off) + last;
            if (outputs[c_inter])
               outputs[c_inter][p_inter] += val;
            if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            if (c->sequence_p) last = val;
            div *= c->lookup_values;
         }
      } else
   #endif
      {
         z *= c->dimensions;
         if (c->sequence_p) {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
               last = val;
            }
         } else {
            for (i=0; i < effective; ++i) {
               float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
               if (outputs[c_inter])
                  outputs[c_inter][p_inter] += val;
               if (++c_inter == ch) { c_inter = 0; ++p_inter; }
            }
         }
      }

      total_decode -= effective;
   }
   *c_inter_p = c_inter;
   *p_inter_p = p_inter;
   return TRUE;
}